

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Parameters *extraout_RDX_00;
  Parameters *extraout_RDX_01;
  Parameters *extraout_RDX_02;
  Environment env;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  VkFramebuffer local_518;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_510;
  Move<vk::Handle<(vk::HandleType)23>_> local_4f8;
  Move<vk::Handle<(vk::HandleType)23>_> local_4d8;
  Move<vk::Handle<(vk::HandleType)23>_> local_4b8;
  Environment local_490;
  Move<vk::Handle<(vk::HandleType)23>_> local_458;
  Resources local_438;
  Resources local_330;
  Resources local_228;
  Resources local_120;
  
  local_490.vkp = *(PlatformInterface **)(this + 8);
  local_490.vkd = Context::getDeviceInterface((Context *)this);
  local_490.device = Context::getDevice((Context *)this);
  local_490.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_490.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_490.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_490.maxResourceConsumers = 1;
  Framebuffer::Resources::Resources(&local_120,&local_490,extraout_RDX);
  Framebuffer::Resources::Resources(&local_228,&local_490,extraout_RDX_00);
  Framebuffer::Resources::Resources(&local_330,&local_490,extraout_RDX_01);
  Framebuffer::Resources::Resources(&local_438,&local_490,extraout_RDX_02);
  Framebuffer::create(&local_4d8,&local_490,&local_120,param_4);
  DStack_510.m_device =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_510.m_allocator =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_518.m_internal =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  DStack_510.m_deviceIface =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_4f8,&local_490,&local_228,param_4);
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_4b8,&local_490,&local_330,param_4);
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_458,&local_490,&local_438,param_4);
  local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  if (local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_4b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_458.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_4f8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_4d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_518.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_510,local_518);
  }
  local_518.m_internal = (deUint64)&DStack_510.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_518.m_internal,
             (undefined1 *)
             ((long)&(DStack_510.m_deviceIface)->_vptr_DeviceInterface + local_518.m_internal));
  if ((VkDevice *)local_518.m_internal != &DStack_510.m_device) {
    operator_delete((void *)local_518.m_internal,(ulong)(DStack_510.m_device + 1));
  }
  Framebuffer::Resources::~Resources(&local_438);
  Framebuffer::Resources::~Resources(&local_330);
  Framebuffer::Resources::~Resources(&local_228);
  Framebuffer::Resources::~Resources(&local_120);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}